

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

string * __thiscall
iutest::PrintToStrings<int,int,int,int,int,int>
          (string *__return_storage_ptr__,iutest *this,char *separate,int *v,int args,int args_1,
          int args_2,int args_3,int args_4)

{
  string *psVar1;
  string local_60;
  undefined1 local_2d;
  int local_2c;
  uint local_28;
  int args_local_2;
  int args_local_1;
  int args_local;
  int *v_local;
  char *separate_local;
  string *str;
  
  args_local_2 = (int)v;
  local_2d = 0;
  psVar1 = __return_storage_ptr__;
  local_2c = args_1;
  local_28 = args;
  _args_local_1 = separate;
  v_local = (int *)this;
  separate_local = (char *)__return_storage_ptr__;
  PrintToString<int>(__return_storage_ptr__,(int *)separate);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)v_local);
  PrintToStrings<int,int,int,int,int>
            (&local_60,(iutest *)v_local,(char *)&args_local_2,(int *)(ulong)local_28,local_2c,
             args_2,args_3,(int)psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return psVar1;
}

Assistant:

inline ::std::string PrintToStrings(const char* separate, const T& v, Args... args)
{
    ::std::string str = PrintToString(v);
    str += separate;
    str += PrintToStrings(separate, args...);
    return str;
}